

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

GenerateRegionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::GenerateRegionSyntax,slang::syntax::GenerateRegionSyntax_const&>
          (BumpAllocator *this,GenerateRegionSyntax *args)

{
  GenerateRegionSyntax *this_00;
  
  this_00 = (GenerateRegionSyntax *)allocate(this,0xa8,8);
  slang::syntax::GenerateRegionSyntax::GenerateRegionSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }